

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall
QRenderRule::drawBackgroundImage(QRenderRule *this,QPainter *p,QRect *rect,QPoint off)

{
  Repeat RVar1;
  char cVar2;
  undefined4 uVar3;
  uint uVar4;
  Representation RVar5;
  int iVar6;
  QStyleSheetBackgroundData *pQVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  QPixmap *pQVar14;
  ulong uVar15;
  Representation RVar16;
  Representation RVar17;
  Representation RVar18;
  uint uVar19;
  long in_FS_OFFSET;
  undefined8 extraout_XMM0_Qa;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  QRect QVar25;
  QRect local_90;
  QSize local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->bg).d.ptr == (QStyleSheetBackgroundData *)0x0) goto LAB_00355491;
  cVar2 = QPixmap::isNull();
  pQVar7 = (this->bg).d.ptr;
  if ((cVar2 != '\0') && (*(int *)(*(long *)&pQVar7->brush + 4) == 0)) goto LAB_00355491;
  pQVar14 = &pQVar7->pixmap;
  cVar2 = QPixmap::isNull();
  if (cVar2 != '\0') goto LAB_00355491;
  RVar16 = off.yp.m_i;
  local_58 = (undefined1  [16])borderRect(this,rect);
  setClip(this,p,(QRect *)local_58);
  pQVar7 = (this->bg).d.ptr;
  if (pQVar7->origin != pQVar7->clip) {
    QPainter::save();
    local_58 = (undefined1  [16])originRect(this,rect,((this->bg).d.ptr)->clip);
    QPainter::setClipRect((QRect *)p,(ClipOperation)local_58);
    pQVar7 = (this->bg).d.ptr;
  }
  RVar18 = off.xp.m_i;
  if (pQVar7->attachment == Attachment_Fixed) {
    RVar18.m_i = 0;
    RVar16.m_i = 0;
  }
  uVar8 = QPixmap::size();
  uVar3 = QPixmap::devicePixelRatio();
  auVar22._0_8_ = (double)(int)((ulong)uVar8 >> 0x20);
  auVar22._8_8_ = (double)(int)uVar8;
  auVar23._8_8_ = extraout_XMM0_Qa;
  auVar23._0_8_ = extraout_XMM0_Qa;
  auVar23 = divpd(auVar22,auVar23);
  dVar20 = (double)((ulong)auVar23._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar23._0_8_;
  dVar21 = (double)((ulong)auVar23._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar23._8_8_;
  auVar24._4_4_ = -(uint)(-2147483648.0 < dVar21);
  auVar24._0_4_ = -(uint)(-2147483648.0 < dVar20);
  auVar24._8_4_ = -(uint)(2147483647.0 < dVar20);
  auVar24._12_4_ = -(uint)(2147483647.0 < dVar21);
  uVar4 = movmskps(uVar3,auVar24);
  uVar19 = (int)dVar21;
  if ((uVar4 & 2) == 0) {
    uVar19 = 0x80000000;
  }
  uVar15 = (ulong)uVar19;
  if ((uVar4 & 8) != 0) {
    uVar15 = 0x7fffffff;
  }
  uVar19 = (int)dVar20;
  if ((uVar4 & 1) == 0) {
    uVar19 = 0x80000000;
  }
  if ((uVar4 & 4) != 0) {
    uVar19 = 0x7fffffff;
  }
  local_80 = (QSize)(((ulong)uVar19 << 0x20) + uVar15);
  pQVar7 = (this->bg).d.ptr;
  local_90 = originRect(this,rect,pQVar7->origin);
  QVar25 = QStyle::alignedRect(LeftToRight,
                               (Alignment)
                               (pQVar7->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                               super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_80,&local_90);
  RVar5 = QVar25.x1.m_i;
  local_58._0_4_ = RVar5.m_i - RVar18.m_i;
  RVar17 = QVar25.y1.m_i;
  local_58._8_4_ = QVar25.x2.m_i.m_i - RVar18.m_i;
  local_58._4_4_ = RVar17.m_i - RVar16.m_i;
  local_58._12_4_ = QVar25.y2.m_i.m_i - RVar16.m_i;
  auVar23 = QRect::operator&((QRect *)local_58,&local_90);
  RVar1 = ((this->bg).d.ptr)->repeat;
  iVar13 = (int)uVar15;
  iVar10 = auVar23._4_4_;
  if (RVar1 == Repeat_X) {
    iVar9 = local_90.x2.m_i - local_90.x1.m_i;
    iVar12 = auVar23._12_4_ - iVar10;
    iVar13 = (RVar18.m_i + iVar13) - (RVar5.m_i - local_90.x1.m_i) % iVar13;
    iVar6 = (RVar16.m_i - RVar17.m_i) + iVar10;
    local_58._8_8_ = (double)iVar10;
    local_58._0_8_ = (double)local_90.x1.m_i;
LAB_003553af:
    local_48 = (double)(iVar9 + 1);
    dStack_40 = (double)(iVar12 + 1);
LAB_003553c2:
    local_70 = (double)iVar6;
    local_78 = (double)iVar13;
    QPainter::drawTiledPixmap((QRectF *)p,(QPixmap *)local_58,(QPointF *)pQVar14);
  }
  else {
    if (RVar1 == Repeat_XY) {
      iVar13 = (RVar18.m_i + iVar13) - (RVar5.m_i - local_90.x1.m_i) % iVar13;
      iVar6 = (RVar16.m_i + uVar19) - (RVar17.m_i - local_90.y1.m_i) % (int)uVar19;
      local_48 = (double)(((long)local_90.x2.m_i - (long)local_90.x1.m_i) + 1);
      local_58._8_8_ = (double)local_90.y1.m_i;
      local_58._0_8_ = (double)local_90.x1.m_i;
      dStack_40 = (double)(((long)local_90.y2.m_i - (long)local_90.y1.m_i) + 1);
      goto LAB_003553c2;
    }
    iVar11 = auVar23._0_4_;
    if (RVar1 == Repeat_Y) {
      iVar9 = auVar23._8_4_ - iVar11;
      iVar12 = local_90.y2.m_i - local_90.y1.m_i;
      iVar13 = (RVar18.m_i - RVar5.m_i) + iVar11;
      iVar6 = (RVar16.m_i + uVar19) - (RVar17.m_i - local_90.y1.m_i) % (int)uVar19;
      local_58._8_8_ = (double)local_90.y1.m_i;
      local_58._0_8_ = (double)iVar11;
      goto LAB_003553af;
    }
    iVar13 = QPixmap::width();
    iVar6 = QPixmap::height();
    local_58._8_8_ = (double)iVar10;
    local_58._0_8_ = (double)iVar11;
    local_78 = (double)((RVar18.m_i - RVar5.m_i) + iVar11);
    local_70 = (double)((RVar16.m_i - RVar17.m_i) + iVar10);
    local_68 = (double)iVar13;
    local_48 = -1.0;
    dStack_40 = -1.0;
    local_60 = (double)iVar6;
    QPainter::drawPixmap((QRectF *)p,(QPixmap *)local_58,(QRectF *)pQVar14);
  }
  pQVar7 = (this->bg).d.ptr;
  if (pQVar7->origin != pQVar7->clip) {
    QPainter::restore();
  }
  unsetClip(this,p);
LAB_00355491:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::drawBackgroundImage(QPainter *p, const QRect &rect, QPoint off)
{
    if (!hasBackground())
        return;

    const QPixmap& bgp = background()->pixmap;
    if (bgp.isNull())
        return;

    setClip(p, borderRect(rect));

    if (background()->origin != background()->clip) {
        p->save();
        p->setClipRect(originRect(rect, background()->clip), Qt::IntersectClip);
    }

    if (background()->attachment == Attachment_Fixed)
        off = QPoint(0, 0);

    QSize bgpSize = bgp.size() / bgp.devicePixelRatio();
    int bgpHeight = bgpSize.height();
    int bgpWidth = bgpSize.width();
    QRect r = originRect(rect, background()->origin);
    QRect aligned = QStyle::alignedRect(Qt::LeftToRight, background()->position, bgpSize, r);
    QRect inter = aligned.translated(-off).intersected(r);

    switch (background()->repeat) {
    case Repeat_Y:
        p->drawTiledPixmap(inter.x(), r.y(), inter.width(), r.height(), bgp,
                           inter.x() - aligned.x() + off.x(),
                           bgpHeight - int(aligned.y() - r.y()) % bgpHeight + off.y());
        break;
    case Repeat_X:
        p->drawTiledPixmap(r.x(), inter.y(), r.width(), inter.height(), bgp,
                           bgpWidth - int(aligned.x() - r.x())%bgpWidth + off.x(),
                           inter.y() - aligned.y() + off.y());
        break;
    case Repeat_XY:
        p->drawTiledPixmap(r, bgp,
                            QPoint(bgpWidth - int(aligned.x() - r.x())% bgpWidth + off.x(),
                                   bgpHeight - int(aligned.y() - r.y())%bgpHeight + off.y()));
        break;
    case Repeat_None:
    default:
        p->drawPixmap(inter.x(), inter.y(), bgp, inter.x() - aligned.x() + off.x(),
                      inter.y() - aligned.y() + off.y(), bgp.width() , bgp.height());
        break;
    }


    if (background()->origin != background()->clip)
        p->restore();

    unsetClip(p);
}